

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::selectionChanged
          (QWidgetTextControlPrivate *this,bool forceEmitSelectionChanged)

{
  QObject *pQVar1;
  undefined8 uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QAccessibleTextSelectionEvent ev;
  undefined1 local_69;
  code *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((int)CONCAT71(in_register_00000031,forceEmitSelectionChanged) != 0) {
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,5,(void **)0x0);
    if ((*(long *)(*(long *)(pQVar1 + 8) + 0x10) != 0) &&
       ((*(byte *)(*(long *)(*(long *)(*(long *)(pQVar1 + 8) + 0x10) + 8) + 0x30) & 1) != 0)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      uVar2 = *(undefined8 *)(*(long *)(pQVar1 + 8) + 0x10);
      iVar5 = QTextCursor::anchor();
      uVar6 = QTextCursor::position();
      uVar7 = 0;
      if (iVar5 != -1) {
        uVar7 = uVar6;
      }
      uStack_50 = (undefined1 *)CONCAT44(uVar7,0xffffffff);
      local_68 = QPixmap::load;
      local_48 = (undefined1 *)CONCAT44(uVar6,iVar5);
      puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,0x121);
      local_58 = (undefined1 *)uVar2;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_68);
    }
  }
  iVar5 = QTextCursor::position();
  if (iVar5 == this->lastSelectionPosition) {
    iVar5 = QTextCursor::anchor();
    if (iVar5 == this->lastSelectionAnchor) goto LAB_004c5609;
  }
  bVar3 = QTextCursor::hasSelection();
  bVar3 = this->lastSelectionPosition == this->lastSelectionAnchor ^ bVar3;
  if (bVar3 == 0) {
    local_69 = QTextCursor::hasSelection();
    puStack_60 = &local_69;
    local_68 = (code *)0x0;
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,4,&local_68);
  }
  if (!forceEmitSelectionChanged) {
    if (bVar3 != 0) {
      cVar4 = QTextCursor::hasSelection();
      if (cVar4 == '\0') goto LAB_004c55d7;
      iVar5 = QTextCursor::position();
      if (iVar5 == this->lastSelectionPosition) {
        iVar5 = QTextCursor::anchor();
        if (iVar5 == this->lastSelectionAnchor) goto LAB_004c55d7;
      }
    }
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,5,(void **)0x0);
    if ((*(long *)(*(long *)(pQVar1 + 8) + 0x10) != 0) &&
       ((*(byte *)(*(long *)(*(long *)(*(long *)(pQVar1 + 8) + 0x10) + 8) + 0x30) & 1) != 0)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      uVar2 = *(undefined8 *)(*(long *)(pQVar1 + 8) + 0x10);
      iVar5 = QTextCursor::anchor();
      uVar6 = QTextCursor::position();
      uVar7 = 0;
      if (iVar5 != -1) {
        uVar7 = uVar6;
      }
      uStack_50 = (undefined1 *)CONCAT44(uVar7,0xffffffff);
      local_68 = QPixmap::load;
      local_48 = (undefined1 *)CONCAT44(uVar6,iVar5);
      puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,0x121);
      local_58 = (undefined1 *)uVar2;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_68);
    }
  }
LAB_004c55d7:
  QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
  iVar5 = QTextCursor::position();
  this->lastSelectionPosition = iVar5;
  iVar5 = QTextCursor::anchor();
  this->lastSelectionAnchor = iVar5;
LAB_004c5609:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::selectionChanged(bool forceEmitSelectionChanged /*=false*/)
{
    Q_Q(QWidgetTextControl);
    if (forceEmitSelectionChanged) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }

    if (cursor.position() == lastSelectionPosition
        && cursor.anchor() == lastSelectionAnchor)
        return;

    bool selectionStateChange = (cursor.hasSelection()
                                 != (lastSelectionPosition != lastSelectionAnchor));
    if (selectionStateChange)
        emit q->copyAvailable(cursor.hasSelection());

    if (!forceEmitSelectionChanged
        && (selectionStateChange
            || (cursor.hasSelection()
                && (cursor.position() != lastSelectionPosition
                    || cursor.anchor() != lastSelectionAnchor)))) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }
    emit q->microFocusChanged();
    lastSelectionPosition = cursor.position();
    lastSelectionAnchor = cursor.anchor();
}